

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uutils.c
# Opt level: O0

int c_string_to_lisp_string(char *C,LispPTR Lisp)

{
  size_t sVar1;
  LispPTR *pLVar2;
  DLword *pDVar3;
  ulong uStack_48;
  char ch;
  size_t i;
  char *dp;
  size_t length;
  char *base;
  OneDArray *arrayp;
  LispPTR Lisp_local;
  char *C_local;
  
  sVar1 = strlen(C);
  if ((*(ushort *)((ulong)(MDStypetbl + (Lisp >> 9)) ^ 2) & 0x7ff) == 0xe) {
    pLVar2 = NativeAligned4FromLAddr(Lisp);
    if ((ulong)(long)(int)pLVar2[3] < sVar1 + 1) {
      C_local._4_4_ = -1;
    }
    else if (*(char *)((long)pLVar2 + 6) == 'C') {
      pDVar3 = NativeAligned2FromLAddr(*pLVar2 & 0xfffffff);
      i = (size_t)C;
      length = (long)pDVar3 + (long)(int)(uint)(ushort)pLVar2[1];
      for (uStack_48 = 0; uStack_48 < sVar1 + 1; uStack_48 = uStack_48 + 1) {
        *(undefined1 *)(length ^ 3) = *(undefined1 *)i;
        i = i + 1;
        length = length + 1;
      }
      C_local._4_4_ = 0;
    }
    else {
      C_local._4_4_ = -1;
    }
  }
  else {
    C_local._4_4_ = -1;
  }
  return C_local._4_4_;
}

Assistant:

static int c_string_to_lisp_string(char *C, LispPTR Lisp) {
  OneDArray *arrayp;
  char *base;
  size_t length;

  length = strlen(C);
  if (GetTypeNumber(Lisp) != TYPE_ONED_ARRAY) { return (-1); }

  arrayp = (OneDArray *)NativeAligned4FromLAddr(Lisp);
  if (arrayp->totalsize < length + 1) { return (-1); }
  /* too short for C string */

  switch (arrayp->typenumber) {
    case THIN_CHAR_TYPENUMBER:
      base = ((char *)NativeAligned2FromLAddr(arrayp->base)) + ((int)(arrayp->offset));
#ifndef BYTESWAP
      strcpy(base, C);
#else
      {
        char *dp = C;
        for (size_t i = 0; i < length + 1; i++) {
          char ch = *dp++;
#ifdef DOS
          if (ch == '\\') dp++; /* skip 2nd \ in \\ in C strings */
#endif /* DOS */
          GETBYTE(base++) = ch;
        }
      }
#endif /* BYTESWAP */

      return 0;
    default: return -1;
  }
}